

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_handle_top(Parser *this)

{
  code *pcVar1;
  csubstr rem_00;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t ahead;
  csubstr fmt;
  csubstr rem;
  csubstr trimmed;
  basic_substring<const_char> local_48;
  basic_substring<const_char> local_30;
  
  local_48.str = (this->m_state->line_contents).rem.str;
  local_48.len = (this->m_state->line_contents).rem.len;
  if ((local_48.len == 0) || (*local_48.str != '#')) {
    local_30 = basic_substring<const_char>::triml(&local_48,' ');
    uVar6 = local_30.len;
    pcVar5 = local_30.str;
    if ((uVar6 == 0) || (*pcVar5 != '%')) {
      if ((3 < uVar6) && (*pcVar5 == '-')) {
        uVar8 = 0;
        do {
          uVar7 = uVar8;
          if (uVar7 == 3) break;
          uVar8 = uVar7 + 1;
        } while (pcVar5[uVar7 + 1] == "--- "[uVar7 + 1]);
        if (2 < uVar7) goto LAB_001d2c92;
      }
      iVar4 = basic_substring<const_char>::compare(&local_30,"---",3);
      if (iVar4 == 0) {
LAB_001d2c92:
        rem_00.len = local_48.len;
        rem_00.str = local_48.str;
        _start_new_doc(this,rem_00);
        if (local_48.len < local_30.len || local_48.len - local_30.len == 0) {
          return true;
        }
        _line_progressed(this,local_48.len - local_30.len);
        _save_indentation(this,0);
        return true;
      }
      if ((3 < uVar6) && (*pcVar5 == '-')) {
        uVar8 = 0;
        do {
          uVar7 = uVar8;
          if (uVar7 == 3) break;
          uVar8 = uVar7 + 1;
        } while (pcVar5[uVar7 + 1] == "---\t"[uVar7 + 1]);
        if (2 < uVar7) goto LAB_001d2c92;
      }
      if ((uVar6 < 3) || (*pcVar5 != '.')) {
LAB_001d2d27:
        bVar2 = is_debugger_attached();
        if ((bVar2) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          uVar3 = (*pcVar1)();
          return (bool)uVar3;
        }
        fmt.len = 0x12;
        fmt.str = "ERROR: parse error";
        _err<>(this,fmt);
        return false;
      }
      uVar6 = 0;
      do {
        uVar8 = uVar6;
        if (uVar8 == 2) break;
        uVar6 = uVar8 + 1;
      } while (pcVar5[uVar8 + 1] == "\t..."[uVar8 + 2]);
      if (uVar8 < 2) goto LAB_001d2d27;
      _end_stream(this);
      if (local_30.len <= local_48.len && local_48.len - local_30.len != 0) {
        _line_progressed(this,local_48.len - local_30.len);
      }
      ahead = 3;
    }
    else {
      _handle_directive(this,local_30);
      ahead = local_48.len;
    }
    _line_progressed(this,ahead);
  }
  else {
    _scan_comment(this);
  }
  return true;
}

Assistant:

bool Parser::_handle_top()
{
    _c4dbgp("handle_top");
    csubstr rem = m_state->line_contents.rem;

    if(rem.begins_with('#'))
    {
        _c4dbgp("a comment line");
        _scan_comment();
        return true;
    }

    csubstr trimmed = rem.triml(' ');

    if(trimmed.begins_with('%'))
    {
        _handle_directive(trimmed);
        _line_progressed(rem.len);
        return true;
    }
    else if(trimmed.begins_with("--- ") || trimmed == "---" || trimmed.begins_with("---\t"))
    {
        _start_new_doc(rem);
        if(trimmed.len < rem.len)
        {
            _line_progressed(rem.len - trimmed.len);
            _save_indentation();
        }
        return true;
    }
    else if(trimmed.begins_with("..."))
    {
        _c4dbgp("end current document");
        _end_stream();
        if(trimmed.len < rem.len)
        {
            _line_progressed(rem.len - trimmed.len);
        }
        _line_progressed(3);
        return true;
    }
    else
    {
        _c4err("parse error");
    }

    return false;
}